

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writeAnchorVolumeDescriptor(IsoWriter *this,uint32_t endPartitionAddr)

{
  uint32_t tagLocation;
  size_t __n;
  uint32_t *buff32;
  uint32_t endPartitionAddr_local;
  IsoWriter *this_local;
  
  memset(this->m_buffer,0,0x800);
  tagLocation = absoluteSectorNum(this);
  anon_unknown.dwarf_b4dde::writeDescriptorTag(this->m_buffer,AnchorVolPtr,tagLocation);
  this->m_buffer[0x10] = '\0';
  this->m_buffer[0x11] = 0x80;
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x14] = ' ';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  this->m_buffer[0x18] = '\0';
  this->m_buffer[0x19] = 0x80;
  this->m_buffer[0x1a] = '\0';
  this->m_buffer[0x1b] = '\0';
  __n = (size_t)endPartitionAddr;
  *(uint32_t *)(this->m_buffer + 0x1c) = endPartitionAddr;
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0x200);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,__n);
  return;
}

Assistant:

void IsoWriter::writeAnchorVolumeDescriptor(const uint32_t endPartitionAddr)
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::AnchorVolPtr, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    buff32[4] = 0x8000;  // point of the main volume descriptor
    buff32[5] = 0x20;
    buff32[6] = 0x8000;
    buff32[7] = endPartitionAddr;  // set size to allocated sectors amount

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}